

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DearchiverBase.cpp
# Opt level: O0

bool __thiscall
Diligent::DearchiverBase::NamedResourceCache<Diligent::IRenderPass>::Get
          (NamedResourceCache<Diligent::IRenderPass> *this,ResourceType Type,char *Name,
          IRenderPass **ppResource)

{
  bool bVar1;
  Char *pCVar2;
  IRenderPass *pIVar3;
  RefCntAutoPtr<Diligent::IRenderPass> Ptr;
  _Node_iterator_base<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::RefCntWeakPtr<Diligent::IRenderPass>_>,_false>
  local_b8;
  NamedResourceKey local_b0;
  _Node_iterator_base<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::RefCntWeakPtr<Diligent::IRenderPass>_>,_false>
  local_98;
  iterator it;
  unique_lock<std::mutex> Lock;
  string msg_1;
  undefined1 local_50 [8];
  string msg;
  IRenderPass **ppResource_local;
  char *Name_local;
  ResourceType Type_local;
  NamedResourceCache<Diligent::IRenderPass> *this_local;
  
  msg.field_2._8_8_ = ppResource;
  if ((Name == (char *)0x0) || (*Name == '\0')) {
    FormatString<char[26],char[35]>
              ((string *)local_50,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"Name != nullptr && Name[0] != \'\\0\'",(char (*) [35])ppResource);
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    ppResource = (IRenderPass **)0x97;
    DebugAssertionFailed
              (pCVar2,"Get",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DearchiverBase.cpp"
               ,0x97);
    std::__cxx11::string::~string((string *)local_50);
  }
  if ((msg.field_2._8_8_ == 0) || (*(long *)msg.field_2._8_8_ != 0)) {
    FormatString<char[26],char[48]>
              ((string *)&Lock._M_owns,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"ppResource != nullptr && *ppResource == nullptr",
               (char (*) [48])ppResource);
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar2,"Get",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DearchiverBase.cpp"
               ,0x98);
    std::__cxx11::string::~string((string *)&Lock._M_owns);
  }
  *(undefined8 *)msg.field_2._8_8_ = 0;
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)&it,&this->m_Mtx);
  DeviceObjectArchive::NamedResourceKey::NamedResourceKey(&local_b0,Type,Name,false);
  local_98._M_cur =
       (__node_type *)
       std::
       unordered_map<Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::RefCntWeakPtr<Diligent::IRenderPass>,_Diligent::DeviceObjectArchive::NamedResourceKey::Hasher,_std::equal_to<Diligent::DeviceObjectArchive::NamedResourceKey>,_std::allocator<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::RefCntWeakPtr<Diligent::IRenderPass>_>_>_>
       ::find(&this->m_Map,&local_b0);
  DeviceObjectArchive::NamedResourceKey::~NamedResourceKey(&local_b0);
  local_b8._M_cur =
       (__node_type *)
       std::
       unordered_map<Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::RefCntWeakPtr<Diligent::IRenderPass>,_Diligent::DeviceObjectArchive::NamedResourceKey::Hasher,_std::equal_to<Diligent::DeviceObjectArchive::NamedResourceKey>,_std::allocator<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::RefCntWeakPtr<Diligent::IRenderPass>_>_>_>
       ::end(&this->m_Map);
  bVar1 = std::__detail::operator==(&local_98,&local_b8);
  if (bVar1) {
    this_local._7_1_ = false;
    Ptr.m_pObject._4_4_ = 1;
  }
  else {
    std::__detail::
    _Node_iterator<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::RefCntWeakPtr<Diligent::IRenderPass>_>,_false,_false>
    ::operator->((_Node_iterator<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::RefCntWeakPtr<Diligent::IRenderPass>_>,_false,_false>
                  *)&local_98);
    RefCntWeakPtr<Diligent::IRenderPass>::Lock
              ((RefCntWeakPtr<Diligent::IRenderPass> *)&stack0xffffffffffffff38);
    bVar1 = RefCntAutoPtr<Diligent::IRenderPass>::operator!
                      ((RefCntAutoPtr<Diligent::IRenderPass> *)&stack0xffffffffffffff38);
    if (!bVar1) {
      pIVar3 = RefCntAutoPtr<Diligent::IRenderPass>::Detach
                         ((RefCntAutoPtr<Diligent::IRenderPass> *)&stack0xffffffffffffff38);
      *(IRenderPass **)msg.field_2._8_8_ = pIVar3;
    }
    this_local._7_1_ = !bVar1;
    Ptr.m_pObject._4_4_ = 1;
    RefCntAutoPtr<Diligent::IRenderPass>::~RefCntAutoPtr
              ((RefCntAutoPtr<Diligent::IRenderPass> *)&stack0xffffffffffffff38);
  }
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&it);
  return this_local._7_1_;
}

Assistant:

bool DearchiverBase::NamedResourceCache<ResType>::Get(ResourceType Type, const char* Name, ResType** ppResource)
{
    VERIFY_EXPR(Name != nullptr && Name[0] != '\0');
    VERIFY_EXPR(ppResource != nullptr && *ppResource == nullptr);
    *ppResource = nullptr;

    std::unique_lock<std::mutex> Lock{m_Mtx};

    auto it = m_Map.find(NamedResourceKey{Type, Name});
    if (it == m_Map.end())
        return false;

    auto Ptr = it->second.Lock();
    if (!Ptr)
        return false;

    *ppResource = Ptr.Detach();
    return true;
}